

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int wally_psbt_sign(wally_psbt *psbt,uchar *key,size_t key_len,uint32_t flags)

{
  _Bool _Var1;
  int iVar2;
  wally_psbt_input *input_00;
  wally_tx_input *txid;
  uint32_t local_194;
  size_t local_190;
  size_t written;
  uchar p2wsh [34];
  size_t local_158;
  size_t type;
  size_t is_found;
  size_t sStack_140;
  uint32_t sighash;
  size_t scriptcode_len;
  size_t keypath_index;
  uchar *scriptcode;
  uchar signature_hash [32];
  wally_tx_input *txin;
  wally_psbt_input *input;
  ulong uStack_e8;
  int ret;
  size_t i;
  size_t is_elements;
  uchar wpkh_sc [25];
  size_t full_pubkey_len;
  size_t pubkey_len;
  uchar full_pubkey [65];
  uchar local_58 [8];
  uchar pubkey [33];
  uint32_t flags_local;
  size_t key_len_local;
  uchar *key_local;
  wally_psbt *psbt_local;
  
  stack0xffffffffffffff48 = 0x41;
  if ((((psbt == (wally_psbt *)0x0) || (psbt->tx == (wally_tx *)0x0)) || (key == (uchar *)0x0)) ||
     ((key_len != 0x20 || ((flags & 0xfffffff0) != 0)))) {
    psbt_local._4_4_ = -2;
  }
  else {
    psbt_local._4_4_ = wally_psbt_is_elements(psbt,&i);
    if (psbt_local._4_4_ == 0) {
      input._4_4_ = wally_ec_public_key_from_private_key(key,0x20,local_58,0x21);
      if (input._4_4_ == 0) {
        input._4_4_ = wally_ec_public_key_decompress(local_58,0x21,(uchar *)&pubkey_len,0x41);
      }
      if (input._4_4_ == 0) {
        for (uStack_e8 = 0; uStack_e8 < psbt->num_inputs; uStack_e8 = uStack_e8 + 1) {
          input_00 = psbt->inputs + uStack_e8;
          txid = psbt->tx->inputs + uStack_e8;
          scriptcode_len = 0;
          input._4_4_ = wally_map_find(&input_00->keypaths,(uchar *)&pubkey_len,0x41,&scriptcode_len
                                      );
          if ((input._4_4_ == 0) && (scriptcode_len == 0)) {
            input._4_4_ = wally_map_find(&input_00->keypaths,local_58,0x21,&scriptcode_len);
          }
          if ((input._4_4_ == 0) && (scriptcode_len != 0)) {
            scriptcode_len = scriptcode_len - 1;
            input._4_4_ = wally_map_find(&input_00->signatures,(uchar *)&pubkey_len,0x41,&type);
            if ((input._4_4_ == 0) && (type == 0)) {
              input._4_4_ = wally_map_find(&input_00->signatures,local_58,0x21,&type);
            }
            if ((input._4_4_ == 0) && (type == 0)) {
              _Var1 = input_get_scriptcode
                                (input_00,txid->index,(uchar **)&keypath_index,
                                 &stack0xfffffffffffffec0);
              if (!_Var1) {
                return -2;
              }
              if (input_00->sighash == 0) {
                local_194 = 1;
              }
              else {
                local_194 = input_00->sighash;
              }
              is_found._4_4_ = local_194;
              if (input_00->witness_utxo == (wally_tx_output *)0x0) {
                if (input_00->utxo != (wally_tx *)0x0) {
                  _Var1 = is_matching_txid(input_00->utxo,txid->txhash,0x20);
                  if (!_Var1) {
                    return -2;
                  }
                  iVar2 = wally_tx_get_btc_signature_hash
                                    (psbt->tx,uStack_e8,(uchar *)keypath_index,sStack_140,0,
                                     is_found._4_4_,0,(uchar *)&scriptcode,0x20);
                  if (iVar2 != 0) {
                    return iVar2;
                  }
                }
              }
              else {
                iVar2 = wally_scriptpubkey_get_type((uchar *)keypath_index,sStack_140,&local_158);
                if (iVar2 != 0) {
                  return iVar2;
                }
                if (local_158 == 8) {
                  iVar2 = wally_scriptpubkey_p2pkh_from_bytes
                                    ((uchar *)(keypath_index + 2),0x14,0,(uchar *)&is_elements,0x19,
                                     &stack0xfffffffffffffec0);
                  if (iVar2 != 0) {
                    return iVar2;
                  }
                  keypath_index = (size_t)&is_elements;
                }
                else {
                  if ((local_158 != 0x10) || (input_00->witness_script == (uchar *)0x0)) {
                    return -2;
                  }
                  iVar2 = wally_witness_program_from_bytes
                                    (input_00->witness_script,input_00->witness_script_len,2,
                                     (uchar *)&written,0x22,&local_190);
                  if (iVar2 != 0) {
                    return iVar2;
                  }
                  if ((sStack_140 != 0x22) ||
                     (iVar2 = memcmp(&written,(void *)keypath_index,0x22), iVar2 != 0)) {
                    return -2;
                  }
                  keypath_index = (size_t)input_00->witness_script;
                  sStack_140 = input_00->witness_script_len;
                }
                if (i == 0) {
                  input._4_4_ = wally_tx_get_btc_signature_hash
                                          (psbt->tx,uStack_e8,(uchar *)keypath_index,sStack_140,
                                           input_00->witness_utxo->satoshi,is_found._4_4_,1,
                                           (uchar *)&scriptcode,0x20);
                }
                else {
                  input._4_4_ = wally_tx_get_elements_signature_hash
                                          (psbt->tx,uStack_e8,(uchar *)keypath_index,sStack_140,
                                           input_00->witness_utxo->value,
                                           input_00->witness_utxo->value_len,is_found._4_4_,1,
                                           (uchar *)&scriptcode,0x20);
                }
                if (input._4_4_ != 0) {
                  return input._4_4_;
                }
              }
              iVar2 = psbt_input_sign(input_00,key,0x20,
                                      (input_00->keypaths).items[scriptcode_len].key,
                                      (input_00->keypaths).items[scriptcode_len].key_len,
                                      (uchar *)&scriptcode,0x20,flags);
              if (iVar2 != 0) {
                return iVar2;
              }
            }
          }
        }
        psbt_local._4_4_ = 0;
      }
      else {
        psbt_local._4_4_ = input._4_4_;
      }
    }
  }
  return psbt_local._4_4_;
}

Assistant:

int wally_psbt_sign(struct wally_psbt *psbt,
                    const unsigned char *key, size_t key_len, uint32_t flags)
{
    unsigned char pubkey[EC_PUBLIC_KEY_LEN], full_pubkey[EC_PUBLIC_KEY_UNCOMPRESSED_LEN];
    const size_t pubkey_len = sizeof(pubkey), full_pubkey_len = sizeof(full_pubkey);
    unsigned char wpkh_sc[WALLY_SCRIPTPUBKEY_P2PKH_LEN];
    size_t is_elements, i;
    int ret;

    if (!psbt || !psbt->tx || !key || key_len != EC_PRIVATE_KEY_LEN ||
        (flags & ~EC_FLAGS_ALL)) {
        return WALLY_EINVAL;
    }

    if ((ret = wally_psbt_is_elements(psbt, &is_elements)) != WALLY_OK)
        return ret;
#ifndef BUILD_ELEMENTS
    if (is_elements)
        return WALLY_EINVAL;
#endif /* ndef BUILD_ELEMENTS */

    /* Get the pubkey */
    ret = wally_ec_public_key_from_private_key(key, key_len,
                                               pubkey, pubkey_len);
    if (ret == WALLY_OK)
        ret = wally_ec_public_key_decompress(pubkey, pubkey_len,
                                             full_pubkey, full_pubkey_len);
    if (ret != WALLY_OK)
        return ret;

    /* Go through each of the inputs */
    for (i = 0; i < psbt->num_inputs; ++i) {
        struct wally_psbt_input *input = &psbt->inputs[i];
        struct wally_tx_input *txin = &psbt->tx->inputs[i];
        unsigned char signature_hash[SHA256_LEN];
        const unsigned char *scriptcode;
        size_t keypath_index = 0, scriptcode_len;
        uint32_t sighash;

        /* See if this input has a keypath matching the pubkey of the private key supplied */
        ret = wally_map_find(&input->keypaths, full_pubkey, full_pubkey_len, &keypath_index);
        if (ret == WALLY_OK && !keypath_index)
            ret = wally_map_find(&input->keypaths, pubkey, pubkey_len, &keypath_index);
        if (ret != WALLY_OK)
            continue;

        if (!keypath_index)
            continue; /* Didn't find a keypath matching this pubkey: skip it */
        keypath_index -= 1; /* Use 0 based index below */

        /* Make sure we don't already have a sig for this input */
        size_t is_found;
        ret = wally_map_find(&input->signatures, full_pubkey, full_pubkey_len, &is_found);
        if (ret == WALLY_OK && !is_found)
            ret = wally_map_find(&input->signatures, pubkey, pubkey_len, &is_found);

        if (ret != WALLY_OK || is_found)
            continue; /* Already got a partial sig for this pubkey on this input */

        /* From this point, any failure to sign returns an error, since we
        * have the key to sign this input we are expected to be able to */

        if (!input_get_scriptcode(input, txin->index, &scriptcode, &scriptcode_len))
            return WALLY_EINVAL; /* Couldn't find the script to sign with */

        sighash = input->sighash ? input->sighash : WALLY_SIGHASH_ALL;

        if (input->witness_utxo) {
            size_t type;

            ret = wally_scriptpubkey_get_type(scriptcode, scriptcode_len, &type);
            if (ret != WALLY_OK)
                return ret;

            if (type == WALLY_SCRIPT_TYPE_P2WPKH) {
                ret = wally_scriptpubkey_p2pkh_from_bytes(&scriptcode[2],
                                                          HASH160_LEN, 0,
                                                          wpkh_sc, sizeof(wpkh_sc),
                                                          &scriptcode_len);
                if (ret != WALLY_OK)
                    return ret;

                scriptcode = wpkh_sc;
            } else if (type == WALLY_SCRIPT_TYPE_P2WSH && input->witness_script) {
                unsigned char p2wsh[WALLY_SCRIPTPUBKEY_P2WSH_LEN];
                size_t written;

                ret = wally_witness_program_from_bytes(input->witness_script,
                                                       input->witness_script_len,
                                                       WALLY_SCRIPT_SHA256,
                                                       p2wsh, sizeof(p2wsh),
                                                       &written);
                if (ret != WALLY_OK)
                    return ret;

                if (scriptcode_len != sizeof(p2wsh) ||
                    memcmp(p2wsh, scriptcode, sizeof(p2wsh)))
                    return WALLY_EINVAL;

                scriptcode = input->witness_script;
                scriptcode_len = input->witness_script_len;
            } else
                return WALLY_EINVAL; /* Unknown scriptPubKey type/not enough info */

#ifdef BUILD_ELEMENTS
            if (is_elements)
                ret = wally_tx_get_elements_signature_hash(psbt->tx, i,
                                                           scriptcode, scriptcode_len,
                                                           input->witness_utxo->value,
                                                           input->witness_utxo->value_len,
                                                           sighash,
                                                           WALLY_TX_FLAG_USE_WITNESS,
                                                           signature_hash, SHA256_LEN);
            else
#endif /* BUILD_ELEMENTS */
            ret = wally_tx_get_btc_signature_hash(psbt->tx, i,
                                                  scriptcode, scriptcode_len,
                                                  input->witness_utxo->satoshi,
                                                  sighash,
                                                  WALLY_TX_FLAG_USE_WITNESS,
                                                  signature_hash, SHA256_LEN);
            if (ret != WALLY_OK)
                return ret;
        } else if (input->utxo) {
            if (!is_matching_txid(input->utxo,
                                  txin->txhash, sizeof(txin->txhash)))
                return WALLY_EINVAL; /* prevout doesn't match this input */

            ret = wally_tx_get_btc_signature_hash(psbt->tx, i,
                                                  scriptcode, scriptcode_len,
                                                  0, sighash, 0,
                                                  signature_hash, SHA256_LEN);
            if (ret != WALLY_OK)
                return ret;
        }

        ret = psbt_input_sign(input, key, key_len,
                              input->keypaths.items[keypath_index].key,
                              input->keypaths.items[keypath_index].key_len,
                              signature_hash, SHA256_LEN, flags);
        if (ret != WALLY_OK)
            return ret;
    }

    return WALLY_OK;
}